

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegion.cpp
# Opt level: O0

void __thiscall ThreadRegion::printNodes(ThreadRegion *this,ostream *ostream)

{
  bool bVar1;
  ostream *this_00;
  ostream *poVar2;
  ostream *in_RSI;
  long in_RDI;
  Node *in_stack_00000008;
  Node **node;
  iterator __end1;
  iterator __begin1;
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *__range1;
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *in_stack_ffffffffffffff78;
  string local_70 [24];
  ThreadRegion *in_stack_ffffffffffffffa8;
  _Self local_48;
  _Self local_40;
  long local_38;
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  this_00 = std::operator<<(in_RSI,"subgraph ");
  dotName_abi_cxx11_(in_stack_ffffffffffffffa8);
  poVar2 = std::operator<<(this_00,local_30);
  std::operator<<(poVar2," {\n");
  std::__cxx11::string::~string(local_30);
  std::operator<<(local_10,"color = blue\n style = rounded\n");
  local_38 = in_RDI + 0x10;
  local_40._M_node =
       (_Base_ptr)
       std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::begin
                 (in_stack_ffffffffffffff78);
  local_48._M_node =
       (_Base_ptr)
       std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = std::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<Node_*>::operator*((_Rb_tree_const_iterator<Node_*> *)0x1b430a);
    poVar2 = local_10;
    Node::dump_abi_cxx11_(in_stack_00000008);
    std::operator<<(poVar2,local_70);
    std::__cxx11::string::~string(local_70);
    std::_Rb_tree_const_iterator<Node_*>::operator++((_Rb_tree_const_iterator<Node_*> *)this_00);
  }
  std::operator<<(local_10,"}\n");
  return;
}

Assistant:

void ThreadRegion::printNodes(std::ostream &ostream) {
    ostream << "subgraph " << dotName() << " {\n";
    ostream << "color = blue\n style = rounded\n";
    for (const auto &node : nodes_) {
        ostream << node->dump();
    }
    ostream << "}\n";
}